

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

APInt * __thiscall llvm::APInt::operator*=(APInt *this,uint64_t RHS)

{
  bool bVar1;
  uint srcParts;
  APInt *pAVar2;
  uint NumWords;
  uint64_t RHS_local;
  APInt *this_local;
  
  bVar1 = isSingleWord(this);
  if (bVar1) {
    (this->U).VAL = RHS * (this->U).VAL;
  }
  else {
    srcParts = getNumWords(this);
    tcMultiplyPart((this->U).pVal,(this->U).pVal,RHS,0,srcParts,srcParts,false);
  }
  pAVar2 = clearUnusedBits(this);
  return pAVar2;
}

Assistant:

APInt& APInt::operator*=(uint64_t RHS) {
  if (isSingleWord()) {
    U.VAL *= RHS;
  } else {
    unsigned NumWords = getNumWords();
    tcMultiplyPart(U.pVal, U.pVal, RHS, 0, NumWords, NumWords, false);
  }
  return clearUnusedBits();
}